

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalNinjaGenerator::WriteCommandScript
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmdLines,string *outputConfig,string *commandConfig,string *customStep,
          cmGeneratorTarget *target)

{
  cmGlobalGenerator *pcVar1;
  pointer pbVar2;
  int iVar3;
  string *psVar4;
  ostream *poVar5;
  pointer pbVar6;
  string local_280;
  string cmd;
  ofstream script;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (target == (cmGeneratorTarget *)0x0) {
    psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    script.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = (psVar4->_M_dataplus)._M_p;
    script.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)psVar4->_M_string_length;
    cmd._M_dataplus._M_p = &DAT_0000000b;
    cmd._M_string_length = (size_type)anon_var_dwarf_17f521;
    cmStrCat<>(&local_280,(cmAlphaNum *)&script,(cmAlphaNum *)&cmd);
    psVar4 = &local_280;
  }
  else {
    cmGeneratorTarget::GetSupportDirectory_abi_cxx11_((string *)&script,target);
    psVar4 = (string *)&script;
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar4);
  std::__cxx11::string::~string((string *)psVar4);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  (*pcVar1->_vptr_cmGlobalGenerator[0x49])(&script,pcVar1,outputConfig);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&script);
  cmsys::SystemTools::MakeDirectory(__return_storage_ptr__,(mode_t *)0x0);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  iVar3 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[0x26])();
  if ((char)iVar3 != '\0') {
    script.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
         &script.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    script.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)0x1;
    script.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0x2d;
    cmd._M_string_length = (size_type)(commandConfig->_M_dataplus)._M_p;
    cmd._M_dataplus._M_p = (pointer)commandConfig->_M_string_length;
    cmStrCat<>(&local_280,(cmAlphaNum *)&script,(cmAlphaNum *)&cmd);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_280);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::ofstream::ofstream(&script,(__return_storage_ptr__->_M_dataplus)._M_p,_S_out);
  std::operator<<(&script.super_basic_ostream<char,_std::char_traits<char>_>,"set -e\n\n");
  pbVar2 = (cmdLines->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = (cmdLines->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1) {
    std::__cxx11::string::string((string *)&cmd,(string *)pbVar6);
    cmsys::SystemTools::ReplaceString(&cmd,"$$","$");
    poVar5 = std::operator<<(&script.super_basic_ostream<char,_std::char_traits<char>_>,
                             (string *)&cmd);
    std::operator<<(poVar5,'\n');
    std::__cxx11::string::~string((string *)&cmd);
  }
  std::ofstream::~ofstream(&script);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::WriteCommandScript(
  std::vector<std::string> const& cmdLines, std::string const& outputConfig,
  std::string const& commandConfig, std::string const& customStep,
  cmGeneratorTarget const* target) const
{
  std::string scriptPath;
  if (target) {
    scriptPath = target->GetSupportDirectory();
  } else {
    scriptPath = cmStrCat(this->GetCurrentBinaryDirectory(), "/CMakeFiles");
  }
  scriptPath += this->GetGlobalNinjaGenerator()->ConfigDirectory(outputConfig);
  cmSystemTools::MakeDirectory(scriptPath);
  scriptPath += '/';
  scriptPath += customStep;
  if (this->GlobalGenerator->IsMultiConfig()) {
    scriptPath += cmStrCat('-', commandConfig);
  }
#ifdef _WIN32
  scriptPath += ".bat";
#else
  scriptPath += ".sh";
#endif

  cmsys::ofstream script(scriptPath.c_str());

#ifdef _WIN32
  script << "@echo off\n";
  int line = 1;
#else
  script << "set -e\n\n";
#endif

  for (auto const& i : cmdLines) {
    std::string cmd = i;
    // The command line was built assuming it would be written to
    // the build.ninja file, so it uses '$$' for '$'.  Remove this
    // for the raw shell script.
    cmSystemTools::ReplaceString(cmd, "$$", "$");
#ifdef _WIN32
    script << cmd << " || (set FAIL_LINE=" << ++line << "& goto :ABORT)"
           << '\n';
#else
    script << cmd << '\n';
#endif
  }

#ifdef _WIN32
  script << "goto :EOF\n\n"
            ":ABORT\n"
            "set ERROR_CODE=%ERRORLEVEL%\n"
            "echo Batch file failed at line %FAIL_LINE% "
            "with errorcode %ERRORLEVEL%\n"
            "exit /b %ERROR_CODE%";
#endif

  return scriptPath;
}